

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

_Bool regime_has_2_ranges(ARMMMUIdx mmu_idx)

{
  _Bool local_9;
  ARMMMUIdx mmu_idx_local;
  
  if (((mmu_idx - ARMMMUIdx_E10_0 < 4) || (mmu_idx - ARMMMUIdx_E20_2 < 5)) ||
     (mmu_idx - ARMMMUIdx_Stage1_E0 < 3)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static inline bool regime_has_2_ranges(ARMMMUIdx mmu_idx)
{
    switch (mmu_idx) {
    case ARMMMUIdx_Stage1_E0:
    case ARMMMUIdx_Stage1_E1:
    case ARMMMUIdx_Stage1_E1_PAN:
    case ARMMMUIdx_E10_0:
    case ARMMMUIdx_E10_1:
    case ARMMMUIdx_E10_1_PAN:
    case ARMMMUIdx_E20_0:
    case ARMMMUIdx_E20_2:
    case ARMMMUIdx_E20_2_PAN:
    case ARMMMUIdx_SE10_0:
    case ARMMMUIdx_SE10_1:
    case ARMMMUIdx_SE10_1_PAN:
        return true;
    default:
        return false;
    }
}